

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resultsummary.cpp
# Opt level: O2

void __thiscall trun::ResultSummary::AddResult(ResultSummary *this,Ref *tfunc)

{
  Ref result;
  __shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  std::__shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_28,
             &(((tfunc->super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              testResult).super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>);
  std::mutex::lock(&this->lock);
  std::vector<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>::
  push_back(&this->testFunctions,tfunc);
  std::
  vector<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>::
  push_back(&this->results,(value_type *)&local_28);
  this->testsExecuted = this->testsExecuted + 1;
  if ((local_28._M_ptr)->testResult != kTestResult_Pass) {
    this->testsFailed = this->testsFailed + 1;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->lock);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  return;
}

Assistant:

void ResultSummary::AddResult(const TestFunc::Ref tfunc) {
    auto result = tfunc->Result();

#ifdef TRUN_HAVE_THREADS
    std::lock_guard<std::mutex> guard(lock);
#endif

    testFunctions.push_back(tfunc);
    results.push_back(result);

    testsExecuted++;
    if (result->Result() != kTestResult_Pass) {
        testsFailed++;
    }
}